

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_funcset_dep(CVmImageLoader *this,ulong siz)

{
  uint uVar1;
  ulong read_len;
  bool bVar2;
  ulong siz_local;
  char buf [256];
  
  siz_local = siz;
  if ((this->field_0x90 & 2) == 0) {
    this->field_0x90 = this->field_0x90 | 2;
    CVmBifTable::clear(G_bif_table_X);
    read_data(this,buf,2,&siz_local);
    uVar1 = (uint)(ushort)buf._0_2_;
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      read_data(this,buf,1,&siz_local);
      read_len = (ulong)(byte)buf[0];
      read_data(this,buf,read_len,&siz_local);
      buf[read_len] = '\0';
      CVmBifTable::add_entry(G_bif_table_X,buf);
    }
    return;
  }
  err_throw(0x13b);
}

Assistant:

void CVmImageLoader::load_funcset_dep(VMG_ ulong siz)
{
    char buf[256];
    uint entry_cnt;
    uint i;

    /* it's an error if we've already seen a dependency block */
    if (loaded_funcset_dep_)
        err_throw(VMERR_IMAGE_FUNCDEP_REDEF);

    /* note that we've loaded a dependency block */
    loaded_funcset_dep_ = TRUE;

    /* 
     *   reset the global function set dependency table, in case there was
     *   anything defined by a previously-loaded image - since a function
     *   set index in the table is implicit in the load order, we need to
     *   make sure we're starting with a completely clean configuration 
     */
    G_bif_table->clear(vmg0_);

    /* read the number of entries in the table */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        uint len;

        /* read the length of the entry */
        read_data(buf, 1, &siz);
        len = (uchar)buf[0];

        /* read the name and null-terminate it */
        read_data(buf, len, &siz);
        buf[len] = '\0';

        /* add the dependency */
        G_bif_table->add_entry(vmg_ buf);
    }
}